

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O0

PKCS7 * d2i_PKCS7(PKCS7 **a,uchar **in,long len)

{
  uint8_t *puVar1;
  PKCS7 *ret;
  CBS cbs;
  size_t len_local;
  uint8_t **inp_local;
  PKCS7 **out_local;
  
  cbs.len = len;
  CBS_init((CBS *)&ret,*in,len);
  out_local = (PKCS7 **)pkcs7_new((CBS *)&ret);
  if ((PKCS7 *)out_local == (PKCS7 *)0x0) {
    out_local = (PKCS7 **)0x0;
  }
  else {
    puVar1 = CBS_data((CBS *)&ret);
    *in = puVar1;
    if (a != (PKCS7 **)0x0) {
      PKCS7_free(*a);
      *a = (PKCS7 *)out_local;
    }
  }
  return (PKCS7 *)out_local;
}

Assistant:

PKCS7 *d2i_PKCS7(PKCS7 **out, const uint8_t **inp, size_t len) {
  CBS cbs;
  CBS_init(&cbs, *inp, len);
  PKCS7 *ret = pkcs7_new(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  *inp = CBS_data(&cbs);
  if (out != NULL) {
    PKCS7_free(*out);
    *out = ret;
  }
  return ret;
}